

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall luna::GC::CheckGC(GC *this)

{
  ofstream *poVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if ((this->gen0_).threshold_count_ <= (this->gen0_).count_) {
    clock();
    if ((this->gen1_).count_ < (this->gen1_).threshold_count_) {
      MinorGC(this);
      pcVar4 = "minor";
    }
    else {
      MajorGCMark(this);
      MajorGCSweep(this);
      std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::clear(&this->barriered_);
      pcVar4 = "major";
    }
    clock();
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      poVar1 = &this->log_stream_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," microseconds]: ",0x10);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void GC::CheckGC()
    {
        if (gen0_.count_ >= gen0_.threshold_count_)
        {
            unsigned int gen0_count = gen0_.count_;
            unsigned int gen0_threshold = gen0_.threshold_count_;
            unsigned int gen1_count = gen1_.count_;
            unsigned int gen1_threshold = gen1_.threshold_count_;
            unsigned int gen2_count = gen2_.count_;
            unsigned int gen2_threshold = gen2_.threshold_count_;

            const char *gc_name = "";
            clock_t start = clock();
            if (gen1_.count_ >= gen1_.threshold_count_)
            {
                gc_name = "major";
                MajorGC();
            }
            else
            {
                gc_name = "minor";
                MinorGC();
            }

            clock_t duration = clock() - start;
            unsigned int microseconds = duration * 1000000 / CLOCKS_PER_SEC;
            GC_LOG(gc_name << "[" << microseconds << " microseconds]: " <<
                   gen0_count << " " << gen0_threshold << " | " <<
                   gen1_count << " " << gen1_threshold << " | " <<
                   gen2_count << " " << gen2_threshold << " - " <<
                   gen0_.count_ << " " << gen0_.threshold_count_ << " | " <<
                   gen1_.count_ << " " << gen1_.threshold_count_ << " | " <<
                   gen2_.count_ << " " << gen2_.threshold_count_);
        }
    }